

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mappingExample.cpp
# Opt level: O0

double GetMapping<double>(double mapMe,vector<double,_std::allocator<double>_> *mappings)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  int local_24;
  bool keepLooking;
  value_type vStack_20;
  int i;
  double result;
  vector<double,_std::allocator<double>_> *mappings_local;
  double mapMe_local;
  
  bVar2 = true;
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Mapping range: ");
  for (local_24 = 0; sVar3 = std::vector<double,_std::allocator<double>_>::size(mappings),
      (ulong)(long)local_24 < sVar3; local_24 = local_24 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(mappings,(long)local_24);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar4);
    std::operator<<(poVar5," ");
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  local_24 = 0;
  vStack_20 = mapMe;
  while( true ) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size(mappings);
    bVar1 = false;
    if ((ulong)(long)local_24 < sVar3) {
      bVar1 = bVar2;
    }
    if (!bVar1) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(mappings,(long)local_24);
    if (*pvVar4 < mapMe) {
      local_24 = local_24 + 1;
    }
    else {
      pvVar4 = std::vector<double,_std::allocator<double>_>::at(mappings,(long)local_24);
      vStack_20 = *pvVar4;
      bVar2 = false;
    }
  }
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,mapMe);
  poVar5 = std::operator<<(poVar5," is mapped to ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,vStack_20);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  return vStack_20;
}

Assistant:

MapType GetMapping(MapType mapMe, vector<MapType> mappings){
   MapType result = mapMe;
   int i;
   bool keepLooking;

   keepLooking = true;

   cout << endl;
   cout << "Mapping range: ";
   for (i = 0; i < mappings.size(); ++i) {
      cout << mappings.at(i) << " ";
   }
   cout << endl;

   i = 0;       // Restart counting
   while ((i < mappings.size()) && keepLooking) {
      if(mapMe <= mappings.at(i)) {
         result = mappings.at(i);
         keepLooking = false;
      }
      else {
         ++i;
      }
   }

   cout << mapMe << " is mapped to " << result << endl;

   return result;
}